

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O3

void __thiscall TextReader::parse_dec(TextReader *this)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  size_t sVar4;
  string local_38;
  
  sVar4 = this->current_token_len_;
  uVar2 = (this->current_line_)._M_string_length;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  do {
    sVar4 = sVar4 + 1;
    this->current_token_len_ = sVar4;
    if (uVar2 <= this->current_token_pos_ + sVar4) {
      return;
    }
    bVar1 = pcVar3[sVar4 + this->current_token_pos_];
  } while ((byte)(bVar1 - 0x30) < 10);
  if ('@' < (char)bVar1) {
    if (0x5a < bVar1) {
      if (bVar1 < 0x61) {
        if (bVar1 != 0x5f) {
          return;
        }
      }
      else if (0x7a < bVar1) {
        return;
      }
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Invalid symbol in decimal value","");
    parse_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return;
  }
  return;
}

Assistant:

inline void parse_dec() {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_dec_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_DEC_INVALID_SYMBOL);
        };
    }